

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::DGXMLScanner::buildAttList
          (DGXMLScanner *this,XMLSize_t attCount,XMLElementDecl *elemDecl,
          RefVectorOf<xercesc_4_0::XMLAttr> *toFill)

{
  bool bVar1;
  ulong uVar2;
  XMLValidator *pXVar3;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *this_00;
  XMLSize_t XVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  RefHashTableBucketElem<unsigned_int> *pRVar11;
  XMLCh *pXVar12;
  XMLAttr *this_01;
  XMLCh *pXVar13;
  ulong uVar14;
  ulong uVar15;
  AttTypes AVar16;
  undefined4 extraout_var;
  
  iVar6 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])(elemDecl);
  if ((attCount == 0 & ((byte)iVar6 ^ 1)) == 0) {
    if ((byte)iVar6 != 0) {
      uVar2 = (toFill->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fCurCount;
      iVar6 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])(elemDecl);
      plVar8 = (long *)CONCAT44(extraout_var,iVar6);
      lVar9 = (**(code **)(*plVar8 + 0x50))(plVar8);
      if (lVar9 != 0) {
        uVar15 = 0;
        do {
          plVar10 = (long *)(**(code **)(*plVar8 + 0x58))(plVar8,uVar15);
          for (pRVar11 = this->fAttDefRegistry->fBucketList
                         [(ulong)plVar10 % this->fAttDefRegistry->fHashModulus];
              pRVar11 != (RefHashTableBucketElem<unsigned_int> *)0x0; pRVar11 = pRVar11->fNext) {
            if ((long *)pRVar11->fKey == plVar10) {
              if ((pRVar11->fData != (uint *)0x0) && (this->fElemCount <= *pRVar11->fData))
              goto LAB_00297ead;
              break;
            }
          }
          uVar7 = *(uint *)(plVar10 + 1);
          bVar5 = (this->super_XMLScanner).fValidate;
          if ((bool)bVar5 == true) {
            if (uVar7 == 2) {
              pXVar3 = (this->super_XMLScanner).fValidator;
              pXVar12 = (XMLCh *)(**(code **)(*plVar10 + 0x28))(plVar10);
              XMLValidator::emitError
                        (pXVar3,RequiredAttrNotProvided,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,
                         (XMLCh *)0x0);
            }
            else if (uVar7 < 2) {
              if (((this->super_XMLScanner).fStandalone == true) &&
                 (*(char *)((long)plVar10 + 0x14) == '\x01')) {
                pXVar3 = (this->super_XMLScanner).fValidator;
                pXVar12 = (XMLCh *)(**(code **)(*plVar10 + 0x28))(plVar10);
                pXVar13 = QName::getRawName(elemDecl->fElementName);
                XMLValidator::emitError
                          (pXVar3,NoDefAttForStandalone,pXVar12,pXVar13,(XMLCh *)0x0,(XMLCh *)0x0);
                bVar5 = (this->super_XMLScanner).fValidate;
              }
              goto LAB_00297c98;
            }
          }
          else if (uVar7 < 2) {
LAB_00297c98:
            if ((bVar5 & 1) != 0) {
              pXVar3 = (this->super_XMLScanner).fValidator;
              (*pXVar3->_vptr_XMLValidator[8])(pXVar3,plVar10,plVar10[4]);
            }
            if (attCount < uVar2) {
              this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                  (&((this->super_XMLScanner).fAttrList)->
                                    super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,attCount);
              if ((this->super_XMLScanner).fDoNamespaces == true) {
                uVar7 = (this->super_XMLScanner).fEmptyNamespaceId;
                pXVar13 = (XMLCh *)(**(code **)(*plVar10 + 0x28))(plVar10);
                pXVar12 = (XMLCh *)plVar10[4];
                AVar16 = *(AttTypes *)((long)plVar10 + 0xc);
                QName::setName(this_01->fAttName,pXVar13,uVar7);
              }
              else {
                pXVar13 = (XMLCh *)(**(code **)(*plVar10 + 0x28))(plVar10);
                pXVar12 = (XMLCh *)plVar10[4];
                AVar16 = *(AttTypes *)((long)plVar10 + 0xc);
                QName::setName(this_01->fAttName,L"",pXVar13,0);
              }
              XMLAttr::setValue(this_01,pXVar12);
              this_01->fType = AVar16;
              this_01->fSpecified = false;
            }
            else {
              bVar1 = (this->super_XMLScanner).fDoNamespaces;
              this_01 = (XMLAttr *)
                        XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
              if (bVar1 == true) {
                uVar7 = (this->super_XMLScanner).fEmptyNamespaceId;
                pXVar12 = (XMLCh *)(**(code **)(*plVar10 + 0x28))(plVar10);
                XMLAttr::XMLAttr(this_01,uVar7,pXVar12,(XMLCh *)plVar10[4],
                                 *(AttTypes *)((long)plVar10 + 0xc),false,
                                 (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,
                                 false);
              }
              else {
                pXVar12 = (XMLCh *)(**(code **)(*plVar10 + 0x28))(plVar10);
                XMLAttr::XMLAttr(this_01,0,pXVar12,L"",(XMLCh *)plVar10[4],
                                 *(AttTypes *)((long)plVar10 + 0xc),false,
                                 (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,
                                 false);
              }
              this_00 = &((this->super_XMLScanner).fAttrList)->
                         super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
              BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(this_00,1);
              XVar4 = this_00->fCurCount;
              this_00->fElemList[XVar4] = this_01;
              this_00->fCurCount = XVar4 + 1;
            }
            if ((((this->super_XMLScanner).fDoNamespaces == true) &&
                (pXVar12 = this_01->fAttName->fPrefix, pXVar12 != (XMLCh *)0x0)) &&
               (*pXVar12 != L'\0')) {
              uVar7 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar12,Mode_Attribute);
              XMLAttr::setURIId(this_01,uVar7);
            }
            attCount = attCount + 1;
          }
LAB_00297ead:
          uVar15 = uVar15 + 1;
          uVar14 = (**(code **)(*plVar8 + 0x50))(plVar8);
        } while (uVar15 < uVar14);
      }
    }
  }
  else {
    attCount = 0;
  }
  return attCount;
}

Assistant:

XMLSize_t
DGXMLScanner::buildAttList(const XMLSize_t              attCount
                          ,       XMLElementDecl*       elemDecl
                          ,       RefVectorOf<XMLAttr>& toFill)
{
    //  Ask the element to clear the 'provided' flag on all of the att defs
    //  that it owns, and to return us a boolean indicating whether it has
    //  any defs.
    const bool hasDefs = elemDecl->hasAttDefs();

    //  If there are no expliclitily provided attributes and there are no
    //  defined attributes for the element, the we don't have anything to do.
    //  So just return zero in this case.
    if (!hasDefs && !attCount)
        return 0;

    // Keep up with how many attrs we end up with total
    XMLSize_t retCount = attCount;

    //  And get the current size of the output vector. This lets us use
    //  existing elements until we fill it, then start adding new ones.
    const XMLSize_t curAttListSize = toFill.size();

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (hasDefs)
    {
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            XMLAttDef& curDef = attDefList.getAttDef(i);

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());
                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (retCount >= curAttListSize)
                    {
                        if (fDoNamespaces)
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }
                        else
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }

                        fAttrList->addElement(curAtt);
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(retCount);
                        if (fDoNamespaces)
                        {
                            curAtt->set
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        else
                        {
                            curAtt->set
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        curAtt->setSpecified(false);
                    }

                    if (fDoNamespaces)
                    {
                        //  Map the new attribute's prefix to a URI id and store
                        //  that in the attribute object.
                        const XMLCh* attPrefix = curAtt->getPrefix();
                        if (attPrefix && *attPrefix) {
                            curAtt->setURIId
                            (
                                resolvePrefix(attPrefix, ElemStack::Mode_Attribute)
                            );
                        }
                    }

                    retCount++;
                }
            }
        }
    }

    return retCount;
}